

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

void ecc_weierstrass_tangent_slope(WeierstrassPoint *P,mp_int **lambda_n,mp_int **lambda_d)

{
  WeierstrassCurve *pWVar1;
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  mp_int *x_02;
  mp_int *y;
  mp_int *y_00;
  mp_int *pmVar2;
  
  pWVar1 = P->wc;
  x = monty_mul(pWVar1->mc,P->X,P->X);
  x_00 = monty_add(pWVar1->mc,x,x);
  x_01 = monty_add(pWVar1->mc,x_00,x);
  x_02 = monty_mul(pWVar1->mc,P->Z,P->Z);
  y = monty_mul(pWVar1->mc,x_02,x_02);
  y_00 = monty_mul(pWVar1->mc,pWVar1->a,y);
  pmVar2 = monty_add(pWVar1->mc,x_01,y_00);
  *lambda_n = pmVar2;
  pmVar2 = monty_add(pWVar1->mc,P->Y,P->Y);
  *lambda_d = pmVar2;
  mp_free(x);
  mp_free(x_00);
  mp_free(x_01);
  mp_free(x_02);
  mp_free(y);
  mp_free(y_00);
  return;
}

Assistant:

static inline void ecc_weierstrass_tangent_slope(
    WeierstrassPoint *P, mp_int **lambda_n, mp_int **lambda_d)
{
    WeierstrassCurve *wc = P->wc;

    mp_int *X2 = monty_mul(wc->mc, P->X, P->X);
    mp_int *twoX2 = monty_add(wc->mc, X2, X2);
    mp_int *threeX2 = monty_add(wc->mc, twoX2, X2);
    mp_int *Z2 = monty_mul(wc->mc, P->Z, P->Z);
    mp_int *Z4 = monty_mul(wc->mc, Z2, Z2);
    mp_int *aZ4 = monty_mul(wc->mc, wc->a, Z4);

    *lambda_n = monty_add(wc->mc, threeX2, aZ4);
    *lambda_d = monty_add(wc->mc, P->Y, P->Y);

    mp_free(X2);
    mp_free(twoX2);
    mp_free(threeX2);
    mp_free(Z2);
    mp_free(Z4);
    mp_free(aZ4);
}